

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O2

int squall::detail::
    Stub<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>::
    doit<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>>
              (HSQUIRRELVM vm,SQInteger index,
              function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *f)

{
  int iVar1;
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  newf;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_98;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_70;
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_50;
  
  Fetch<std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_(squall::detail::FetchContext)0>
  ::doit(&local_70,vm,index);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_b8,&local_70);
  local_50.arg.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_50.arg.super__Function_base._M_functor._8_8_ = 0;
  local_50.arg.super__Function_base._M_manager = (_Manager_type)0x0;
  local_50.arg._M_invoker = p_Stack_a0;
  if (local_a8 != (_Manager_type)0x0) {
    local_50.arg.super__Function_base._M_functor._M_unused._M_object = local_b8._M_unused._M_object;
    local_50.arg.super__Function_base._M_functor._8_8_ = local_b8._8_8_;
    local_50.arg.super__Function_base._M_manager = local_a8;
    local_a8 = (_Manager_type)0x0;
    p_Stack_a0 = (_Invoker_type)0x0;
  }
  local_50.f = f;
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::partial_application(&local_98,&local_50);
  iVar1 = Stub<void(std::__cxx11::string_const&)>::
          doit<squall::detail::partial_application<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>&,std::function<int(std::__cxx11::string_const&)>>>
                    (vm,index + 1,&local_98);
  std::_Function_base::~_Function_base(&local_98.arg.super__Function_base);
  std::_Function_base::~_Function_base(&local_50.arg.super__Function_base);
  return iVar1;
}

Assistant:

static int doit(HSQUIRRELVM vm, SQInteger index, F f) {
        auto newf =
            partial(
                f,
                unwrap_type(
                    fetch<H, detail::FetchContext::Argument>(vm, index)));
        return Stub<R (T...)>::doit(vm, index+1, newf);
    }